

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ErrorList.cpp
# Opt level: O0

int __thiscall amrex::AMRErrorTag::SetNGrow(AMRErrorTag *this)

{
  initializer_list<std::pair<const_amrex::AMRErrorTag::TEST,_int>_> __l;
  int iVar1;
  mapped_type_conflict1 *pmVar2;
  iterator in_RDI;
  char *in_stack_00000198;
  int in_stack_000001a4;
  char *in_stack_000001a8;
  char *in_stack_000001b0;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  key_type *in_stack_ffffffffffffffb8;
  allocator_type *in_stack_ffffffffffffffc0;
  less<amrex::AMRErrorTag::TEST> *__comp;
  map<amrex::AMRErrorTag::TEST,_int,_std::less<amrex::AMRErrorTag::TEST>,_std::allocator<std::pair<const_amrex::AMRErrorTag::TEST,_int>_>_>
  *this_00;
  char *in_stack_ffffffffffffffe0;
  
  if (in_RDI[4].first == USER) {
    in_stack_ffffffffffffffe0 = "\"Do not call SetNGrow with USER test\"";
    Assert_host(in_stack_000001b0,in_stack_000001a8,in_stack_000001a4,in_stack_00000198);
  }
  if ((SetNGrow()::ng == '\0') && (iVar1 = __cxa_guard_acquire(&SetNGrow()::ng), iVar1 != 0)) {
    in_stack_ffffffffffffffb8 = (key_type *)0x4;
    in_stack_ffffffffffffffc0 = (allocator_type *)0x5;
    local_58 = 2;
    uStack_50 = 3;
    local_68 = 0x100000000;
    uStack_60 = 0x100000001;
    __comp = (less<amrex::AMRErrorTag::TEST> *)&local_68;
    this_00 = (map<amrex::AMRErrorTag::TEST,_int,_std::less<amrex::AMRErrorTag::TEST>,_std::allocator<std::pair<const_amrex::AMRErrorTag::TEST,_int>_>_>
               *)0x6;
    std::allocator<std::pair<const_amrex::AMRErrorTag::TEST,_int>_>::allocator
              ((allocator<std::pair<const_amrex::AMRErrorTag::TEST,_int>_> *)0x12f4dc6);
    __l._M_len = (size_type)in_stack_ffffffffffffffe0;
    __l._M_array = in_RDI;
    std::
    map<amrex::AMRErrorTag::TEST,_int,_std::less<amrex::AMRErrorTag::TEST>,_std::allocator<std::pair<const_amrex::AMRErrorTag::TEST,_int>_>_>
    ::map(this_00,__l,__comp,in_stack_ffffffffffffffc0);
    std::allocator<std::pair<const_amrex::AMRErrorTag::TEST,_int>_>::~allocator
              ((allocator<std::pair<const_amrex::AMRErrorTag::TEST,_int>_> *)0x12f4df2);
    __cxa_atexit(std::
                 map<amrex::AMRErrorTag::TEST,_int,_std::less<amrex::AMRErrorTag::TEST>,_std::allocator<std::pair<const_amrex::AMRErrorTag::TEST,_int>_>_>
                 ::~map,&SetNGrow::ng,&__dso_handle);
    __cxa_guard_release(&SetNGrow()::ng);
  }
  pmVar2 = std::
           map<amrex::AMRErrorTag::TEST,_int,_std::less<amrex::AMRErrorTag::TEST>,_std::allocator<std::pair<const_amrex::AMRErrorTag::TEST,_int>_>_>
           ::operator[]((map<amrex::AMRErrorTag::TEST,_int,_std::less<amrex::AMRErrorTag::TEST>,_std::allocator<std::pair<const_amrex::AMRErrorTag::TEST,_int>_>_>
                         *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return *pmVar2;
}

Assistant:

int
AMRErrorTag::SetNGrow () const noexcept
{
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(m_test != USER, "Do not call SetNGrow with USER test");
    static std::map<TEST,int> ng = { {GRAD,1}, {RELGRAD,1}, {LESS,0}, {GREATER,0}, {VORT,0}, {BOX,0} };
    return ng[m_test];
}